

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Liby::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  uint uVar2;
  int *piVar3;
  undefined8 *puVar4;
  char *pcVar5;
  int ret;
  in_addr in_addr1;
  sockaddr_in address;
  Socket *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->fp_);
  if (!bVar1) {
    createSocket(this);
  }
  setNoblock(this,true);
  ret._0_2_ = 2;
  in_addr1.s_addr = (this->ep_).addr_;
  ret._2_2_ = (this->ep_).port_;
  uVar2 = ::connect(this->fd_,(sockaddr *)&ret,0x10);
  piVar3 = (int *)(ulong)uVar2;
  if ((int)uVar2 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x73) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      piVar3 = __errno_location();
      pcVar5 = strerror(*piVar3);
      *puVar4 = pcVar5;
      __cxa_throw(puVar4,&char*::typeinfo,0);
    }
  }
  return (int)piVar3;
}

Assistant:

void Socket::connect() {
    if (!fp_) {
        createSocket();
    }

    setNoblock();

    struct sockaddr_in address;
    address.sin_family = AF_INET;
    //    address.sin_len = sizeof(address);
    struct in_addr in_addr1;
    in_addr1.s_addr = ep_.addr_;
    address.sin_addr = in_addr1;
    address.sin_port = ep_.port_;

    int ret = ::connect(fd_, (struct sockaddr *)&address, sizeof(address));
    if (ret < 0 && errno != EINPROGRESS) {
        throw ::strerror(errno);
    }
}